

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

obj * find_oid(level *lev,uint id)

{
  xchar xVar1;
  obj *poVar2;
  int local_34;
  monst *pmStack_30;
  int i;
  monst *mon;
  obj *obj;
  uint id_local;
  level *lev_local;
  
  if ((((lev == (level *)0x0) ||
       (lev_local = (level *)find_oid_lev(lev,id), lev_local == (level *)0x0)) &&
      (lev_local = (level *)o_on(id,invent), lev_local == (level *)0x0)) &&
     (lev_local = (level *)o_on(id,magic_chest_objs), lev_local == (level *)0x0)) {
    for (pmStack_30 = migrating_mons; pmStack_30 != (monst *)0x0; pmStack_30 = pmStack_30->nmon) {
      poVar2 = o_on(id,pmStack_30->minvent);
      if (poVar2 != (obj *)0x0) {
        return poVar2;
      }
    }
    for (pmStack_30 = mydogs; pmStack_30 != (monst *)0x0; pmStack_30 = pmStack_30->nmon) {
      poVar2 = o_on(id,pmStack_30->minvent);
      if (poVar2 != (obj *)0x0) {
        return poVar2;
      }
    }
    for (local_34 = 0; xVar1 = maxledgerno(), local_34 <= xVar1; local_34 = local_34 + 1) {
      if ((levels[local_34] != (level *)0x0) &&
         (poVar2 = find_oid_lev(levels[local_34],id), poVar2 != (obj *)0x0)) {
        return poVar2;
      }
    }
    lev_local = (level *)0x0;
  }
  return (obj *)lev_local;
}

Assistant:

struct obj *find_oid(struct level *lev, unsigned id)
{
	struct obj *obj;
	struct monst *mon;
	int i;

	/* try searching the current level, if any */
	if (lev && (obj = find_oid_lev(lev, id))) return obj;

	/* first check various obj lists directly */
	if ((obj = o_on(id, invent))) return obj;
	if ((obj = o_on(id, magic_chest_objs))) return obj;

	/* not found yet; check inventory for members of various monst lists */
	for (mon = migrating_mons; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;
	for (mon = mydogs; mon; mon = mon->nmon)
	    if ((obj = o_on(id, mon->minvent))) return obj;

	/* search all levels */
	for (i = 0; i <= maxledgerno(); i++)
	    if (levels[i] && (obj = find_oid_lev(levels[i], id))) return obj;

	/* not found at all */
	return NULL;
}